

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  cmFindLibraryHelper *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string regex;
  Name entry;
  undefined1 local_188 [32];
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  pointer local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  RegularExpression local_140;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  _Alloc_hider local_60;
  pointer local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40;
  
  this_00 = (cmFindLibraryHelper *)local_188;
  local_168[0] = false;
  local_158 = (pointer)0x0;
  local_150._M_local_buf[0] = '\0';
  local_140.regmust = (char *)0x0;
  local_140.program = (char *)0x0;
  local_140.progsize = 0;
  local_160._M_p = (pointer)&local_150;
  memset(&local_140,0,0xaa);
  local_168[0] = HasValidSuffix(this,name);
  std::__cxx11::string::_M_assign((string *)&local_160);
  local_70._M_str = &local_40;
  local_50._M_allocated_capacity = 1;
  local_40 = 0x5e;
  local_58 = (this->PrefixRegexStr)._M_dataplus._M_p;
  local_60._M_p = (pointer)(this->PrefixRegexStr)._M_string_length;
  local_70._M_len = (size_t)&DAT_00000001;
  views._M_len = 2;
  views._M_array = &local_70;
  local_50._8_8_ = local_70._M_str;
  cmCatViews_abi_cxx11_((string *)local_188,views);
  RegexFromLiteral(this_00,(string *)local_188,name);
  std::__cxx11::string::_M_append(local_188,(ulong)(this->SuffixRegexStr)._M_dataplus._M_p);
  if (this->OpenBSD == true) {
    std::__cxx11::string::append(local_188);
  }
  std::__cxx11::string::append(local_188);
  cmsys::RegularExpression::compile(&local_140,(char *)local_188._0_8_);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
  emplace_back<cmFindLibraryHelper::Name>(&this->Names,(Name *)local_168);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (local_140.program != (char *)0x0) {
    operator_delete__(local_140.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    operator_delete(local_160._M_p,
                    CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = cmStrCat('^', this->PrefixRegexStr);
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if (this->OpenBSD) {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
  }
  regex += "$";
  entry.Regex.compile(regex);
  this->Names.push_back(std::move(entry));
}